

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int CVodeSetLinearSolver(void *cvode_mem,SUNLinearSolver LS,SUNMatrix A)

{
  long lVar1;
  double dVar2;
  SUNLinearSolver_Type SVar3;
  int iVar4;
  sunindextype sVar5;
  uint uVar6;
  uint *__s;
  N_Vector p_Var7;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  uint local_34;
  
  if (cvode_mem == (void *)0x0) {
    pcVar9 = "Integrator memory is NULL.";
    iVar4 = -1;
    cvode_mem = (CVodeMem)0x0;
    iVar8 = -1;
    goto LAB_005176f2;
  }
  if (LS == (SUNLinearSolver)0x0) {
    pcVar9 = "LS must be non-NULL";
    cvode_mem = (CVodeMem)0x0;
  }
  else if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
          (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_realtype *)0x0))
  {
    pcVar9 = "LS object is missing a required operation";
  }
  else {
    SVar3 = SUNLinSolGetType(LS);
    bVar10 = (SVar3 - SUNLINEARSOLVER_ITERATIVE & 0xfffffffd) != 0;
    lVar1 = *(long *)(*(long *)((long)cvode_mem + 0xe0) + 8);
    if ((*(long *)(lVar1 + 0x58) == 0) || (*(long *)(lVar1 + 0xa0) == 0)) {
LAB_005176d0:
      pcVar9 = "A required vector operation is not implemented.";
    }
    else if (A == (SUNMatrix)0x0 || SVar3 != SUNLINEARSOLVER_MATRIX_EMBEDDED) {
      if (SVar3 == SUNLINEARSOLVER_DIRECT) {
        if (A != (SUNMatrix)0x0) {
LAB_00517713:
          if (*(code **)((long)cvode_mem + 0x400) != (code *)0x0) {
            (**(code **)((long)cvode_mem + 0x400))(cvode_mem);
          }
          *(code **)((long)cvode_mem + 1000) = cvLsInitialize;
          *(code **)((long)cvode_mem + 0x3f0) = cvLsSetup;
          *(code **)((long)cvode_mem + 0x3f8) = cvLsSolve;
          *(code **)((long)cvode_mem + 0x400) = cvLsFree;
          __s = (uint *)malloc(0x138);
          if (__s == (uint *)0x0) {
            pcVar9 = "A memory request failed.";
            iVar4 = -4;
            iVar8 = -4;
            goto LAB_005176f2;
          }
          memset(__s,0,0x138);
          *(SUNLinearSolver *)(__s + 0x12) = LS;
          local_34 = (uint)(SVar3 != SUNLINEARSOLVER_DIRECT);
          *__s = local_34;
          __s[1] = (uint)bVar10;
          if (A == (SUNMatrix)0x0) {
            __s[2] = 0;
            __s[4] = 0;
            __s[5] = 0;
            __s[6] = 0;
            __s[7] = 0;
          }
          else {
            __s[2] = 1;
            *(code **)(__s + 4) = cvLsDQJac;
            *(void **)(__s + 6) = cvode_mem;
          }
          __s[0x3c] = 1;
          __s[0x3e] = 0;
          __s[0x3f] = 0;
          *(code **)(__s + 0x40) = cvLsDQJtimes;
          *(undefined8 *)(__s + 0x42) = *(undefined8 *)((long)cvode_mem + 0x10);
          *(void **)(__s + 0x44) = cvode_mem;
          __s[0x46] = 0;
          *(code **)(__s + 0x48) = cvLsLinSys;
          *(void **)(__s + 0x4a) = cvode_mem;
          __s[0x34] = 0;
          __s[0x35] = 0;
          __s[0x36] = 0;
          __s[0x37] = 0;
          __s[0x38] = 0;
          __s[0x39] = 0;
          *(undefined8 *)(__s + 0x3a) = *(undefined8 *)((long)cvode_mem + 0x18);
          __s[0x22] = 0;
          __s[0x23] = 0;
          __s[0x24] = 0;
          __s[0x25] = 0;
          __s[0x26] = 0;
          __s[0x27] = 0;
          __s[0x28] = 0;
          __s[0x29] = 0;
          __s[0x2a] = 0;
          __s[0x2b] = 0;
          __s[0x2c] = 0;
          __s[0x2d] = 0;
          __s[0x2e] = 0;
          __s[0x2f] = 0;
          __s[0x30] = 0;
          __s[0x31] = 0;
          __s[0x32] = 0;
          __s[0x33] = 0;
          __s[0x20] = 0x33;
          __s[0x21] = 0;
          __s[8] = 1;
          __s[10] = 0x9999999a;
          __s[0xb] = 0x3fc99999;
          __s[0xe] = 0x9999999a;
          __s[0xf] = 0x3fa99999;
          __s[0x4c] = 0;
          if ((LS->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) ||
             (iVar4 = SUNLinSolSetATimes(LS,cvode_mem,cvLsATimes), iVar4 == 0)) {
            if ((LS->ops->setpreconditioner !=
                 (_func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) &&
               (iVar4 = SUNLinSolSetPreconditioner(LS,cvode_mem,(SUNPSetupFn)0x0,(SUNPSolveFn)0x0),
               iVar4 != 0)) {
              pcVar9 = "Error in calling SUNLinSolSetPreconditioner";
              goto LAB_00517951;
            }
            if (A != (SUNMatrix)0x0) {
              *(SUNMatrix *)(__s + 0x14) = A;
              __s[0x16] = 0;
              __s[0x17] = 0;
            }
            p_Var7 = N_VClone(*(N_Vector *)((long)cvode_mem + 0xe0));
            *(N_Vector *)(__s + 0x18) = p_Var7;
            if (p_Var7 != (N_Vector)0x0) {
              p_Var7 = N_VClone(*(N_Vector *)((long)cvode_mem + 0xe0));
              *(N_Vector *)(__s + 0x1a) = p_Var7;
              if (p_Var7 != (N_Vector)0x0) {
                if (SVar3 != SUNLINEARSOLVER_DIRECT) {
                  sVar5 = N_VGetLength(*(N_Vector *)(__s + 0x18));
                  if (sVar5 < 1) {
                    dVar2 = 0.0;
                  }
                  else {
                    sVar5 = N_VGetLength(*(N_Vector *)(__s + 0x18));
                    dVar2 = (double)sVar5;
                    if (dVar2 < 0.0) {
                      dVar2 = sqrt(dVar2);
                    }
                    else {
                      dVar2 = SQRT(dVar2);
                    }
                  }
                  *(double *)(__s + 0x10) = dVar2;
                }
                if (((SVar3 | SUNLINEARSOLVER_MATRIX_ITERATIVE) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
                   || (uVar6 = 1, *(int *)((long)cvode_mem + 0x20) != 2)) {
                  uVar6 = 0;
                }
                __s[0xc] = uVar6;
                *(uint **)((long)cvode_mem + 0x408) = __s;
                return 0;
              }
              iVar4 = -4;
              cvProcessError((CVodeMem)cvode_mem,-4,"CVLS","CVodeSetLinearSolver",
                             "A memory request failed.");
              N_VDestroy(*(N_Vector *)(__s + 0x18));
              goto LAB_00517965;
            }
            pcVar9 = "A memory request failed.";
            iVar4 = -4;
            iVar8 = -4;
          }
          else {
            pcVar9 = "Error in calling SUNLinSolSetATimes";
LAB_00517951:
            iVar4 = -9;
            iVar8 = -9;
          }
          cvProcessError((CVodeMem)cvode_mem,iVar8,"CVLS","CVodeSetLinearSolver",pcVar9);
LAB_00517965:
          free(__s);
          return iVar4;
        }
        pcVar9 = "Incompatible inputs: direct LS requires non-NULL matrix";
      }
      else {
        if (*(long *)(lVar1 + 0x48) == 0) goto LAB_005176d0;
        if (((SVar3 != SUNLINEARSOLVER_MATRIX_EMBEDDED) == bVar10) ||
           (LS->ops->setatimes != (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
          if ((A != (SUNMatrix)0x0) ||
             ((SVar3 | SUNLINEARSOLVER_MATRIX_ITERATIVE) == SUNLINEARSOLVER_MATRIX_EMBEDDED))
          goto LAB_00517713;
          pcVar9 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
        }
        else {
          pcVar9 = "Incompatible inputs: iterative LS must support ATimes routine";
        }
      }
    }
    else {
      pcVar9 = "Incompatible inputs: matrix-embedded LS requires NULL matrix";
    }
  }
  iVar4 = -3;
  iVar8 = -3;
LAB_005176f2:
  cvProcessError((CVodeMem)cvode_mem,iVar8,"CVLS","CVodeSetLinearSolver",pcVar9);
  return iVar4;
}

Assistant:

int CVodeSetLinearSolver(void *cvode_mem, SUNLinearSolver LS,
                         SUNMatrix A)
{
  CVodeMem    cv_mem;
  CVLsMem     cvls_mem;
  int         retval, LSType;
  booleantype iterative;    /* is the solver iterative?    */
  booleantype matrixbased;  /* is a matrix structure used? */

  /* Return immediately if either cvode_mem or LS inputs are NULL */
  if (cvode_mem == NULL) {
    cvProcessError(NULL, CVLS_MEM_NULL, "CVLS",
                   "CVodeSetLinearSolver", MSG_LS_CVMEM_NULL);
    return(CVLS_MEM_NULL);
  }
  if (LS == NULL) {
    cvProcessError(NULL, CVLS_ILL_INPUT, "CVLS",
                   "CVodeSetLinearSolver",
                   "LS must be non-NULL");
    return(CVLS_ILL_INPUT);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* Test if solver is compatible with LS interface */
  if ( (LS->ops->gettype == NULL) || (LS->ops->solve == NULL) ) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS",
                   "CVodeSetLinearSolver",
                   "LS object is missing a required operation");
    return(CVLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if ( (cv_mem->cv_tempv->ops->nvconst == NULL) ||
       (cv_mem->cv_tempv->ops->nvwrmsnorm == NULL) ) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS",
                   "CVodeSetLinearSolver", MSG_LS_BAD_NVECTOR);
    return(CVLS_ILL_INPUT);
  }

  /* Ensure that A is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (A != NULL)) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetLinearSolver",
                    "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return(CVLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative) {

    if (cv_mem->cv_tempv->ops->nvgetlength == NULL) {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS",
                     "CVodeSetLinearSolver", MSG_LS_BAD_NVECTOR);
      return(CVLS_ILL_INPUT);
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL)) {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetLinearSolver",
                     "Incompatible inputs: iterative LS must support ATimes routine");
      return(CVLS_ILL_INPUT);
    }

    if (matrixbased && (A == NULL)) {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetLinearSolver",
                     "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return(CVLS_ILL_INPUT);
    }

  } else if (A == NULL) {

    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetLinearSolver",
                   "Incompatible inputs: direct LS requires non-NULL matrix");
    return(CVLS_ILL_INPUT);

  }

  /* free any existing system solver attached to CVode */
  if (cv_mem->cv_lfree)  cv_mem->cv_lfree(cv_mem);

  /* Set four main system linear solver function fields in cv_mem */
  cv_mem->cv_linit  = cvLsInitialize;
  cv_mem->cv_lsetup = cvLsSetup;
  cv_mem->cv_lsolve = cvLsSolve;
  cv_mem->cv_lfree  = cvLsFree;

  /* Allocate memory for CVLsMemRec */
  cvls_mem = NULL;
  cvls_mem = (CVLsMem) malloc(sizeof(struct CVLsMemRec));
  if (cvls_mem == NULL) {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, "CVLS",
                    "CVodeSetLinearSolver", MSG_LS_MEM_FAIL);
    return(CVLS_MEM_FAIL);
  }
  memset(cvls_mem, 0, sizeof(struct CVLsMemRec));

  /* set SUNLinearSolver pointer */
  cvls_mem->LS = LS;

  /* Linear solver type information */
  cvls_mem->iterative   = iterative;
  cvls_mem->matrixbased = matrixbased;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL) {
    cvls_mem->jacDQ  = SUNTRUE;
    cvls_mem->jac    = cvLsDQJac;
    cvls_mem->J_data = cv_mem;
  } else {
    cvls_mem->jacDQ  = SUNFALSE;
    cvls_mem->jac    = NULL;
    cvls_mem->J_data = NULL;
  }

  cvls_mem->jtimesDQ = SUNTRUE;
  cvls_mem->jtsetup  = NULL;
  cvls_mem->jtimes   = cvLsDQJtimes;
  cvls_mem->jt_f     = cv_mem->cv_f;
  cvls_mem->jt_data  = cv_mem;

  cvls_mem->user_linsys = SUNFALSE;
  cvls_mem->linsys      = cvLsLinSys;
  cvls_mem->A_data      = cv_mem;

  /* Set defaults for preconditioner-related fields */
  cvls_mem->pset   = NULL;
  cvls_mem->psolve = NULL;
  cvls_mem->pfree  = NULL;
  cvls_mem->P_data = cv_mem->cv_user_data;

  /* Initialize counters */
  cvLsInitializeCounters(cvls_mem);

  /* Set default values for the rest of the LS parameters */
  cvls_mem->msbj       = CVLS_MSBJ;
  cvls_mem->jbad       = SUNTRUE;
  cvls_mem->dgmax_jbad = CVLS_DGMAX;
  cvls_mem->eplifac    = CVLS_EPLIN;
  cvls_mem->last_flag  = CVLS_SUCCESS;

  /* If LS supports ATimes, attach CVLs routine */
  if (LS->ops->setatimes) {
    retval = SUNLinSolSetATimes(LS, cv_mem, cvLsATimes);
    if (retval != SUNLS_SUCCESS) {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, "CVLS",
                     "CVodeSetLinearSolver",
                     "Error in calling SUNLinSolSetATimes");
      free(cvls_mem); cvls_mem = NULL;
      return(CVLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner) {
    retval = SUNLinSolSetPreconditioner(LS, cv_mem, NULL, NULL);
    if (retval != SUNLS_SUCCESS) {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, "CVLS",
                     "CVodeSetLinearSolver",
                     "Error in calling SUNLinSolSetPreconditioner");
      free(cvls_mem); cvls_mem = NULL;
      return(CVLS_SUNLS_FAIL);
    }
  }

  /* When using a SUNMatrix object, store pointer to A and initialize savedJ */
  if (A != NULL) {
    cvls_mem->A = A;
    cvls_mem->savedJ = NULL; /* allocated in cvLsInitialize */
  }

  /* Allocate memory for ytemp and x */
  cvls_mem->ytemp = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->ytemp == NULL) {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, "CVLS",
                    "CVodeSetLinearSolver", MSG_LS_MEM_FAIL);
    free(cvls_mem); cvls_mem = NULL;
    return(CVLS_MEM_FAIL);
  }

  cvls_mem->x = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->x == NULL) {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, "CVLS",
                    "CVodeSetLinearSolver", MSG_LS_MEM_FAIL);
    N_VDestroy(cvls_mem->ytemp);
    free(cvls_mem); cvls_mem = NULL;
    return(CVLS_MEM_FAIL);
  }

  /* For iterative LS, compute default norm conversion factor */
  if (iterative)
    cvls_mem->nrmfac = SUNRsqrt( N_VGetLength(cvls_mem->ytemp) );

  /* Check if solution scaling should be enabled */
  if (matrixbased && cv_mem->cv_lmm == CV_BDF)
    cvls_mem->scalesol = SUNTRUE;
  else
    cvls_mem->scalesol = SUNFALSE;

  /* Attach linear solver memory to integrator memory */
  cv_mem->cv_lmem = cvls_mem;

  return(CVLS_SUCCESS);
}